

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Datetime.cpp
# Opt level: O0

bool __thiscall Datetime::initializeEaster(Datetime *this,Pig *pig)

{
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  initializer_list<int> __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  bool bVar1;
  uint uVar2;
  reference literal;
  time_t tVar3;
  reference pvVar4;
  string *local_208;
  tm *local_198;
  tm *t;
  time_t now;
  string local_180 [4];
  int holiday;
  string token;
  allocator<int> local_159;
  int local_158 [6];
  iterator local_140;
  size_type local_138;
  undefined1 local_130 [8];
  vector<int,_std::allocator<int>_> offsets;
  allocator local_110;
  allocator local_10f;
  allocator local_10e;
  allocator local_10d [20];
  allocator local_f9;
  string *local_f8;
  string local_f0 [32];
  string local_d0 [32];
  string local_b0 [32];
  string local_90 [32];
  string local_70 [32];
  iterator local_50;
  size_type local_48;
  undefined1 local_40 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  holidays;
  size_type checkpoint;
  Pig *pig_local;
  Datetime *this_local;
  
  holidays.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)Pig::cursor(pig);
  offsets.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._7_1_ = 1;
  local_f8 = local_f0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f0,"eastermonday",&local_f9);
  local_f8 = local_d0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d0,"easter",local_10d);
  local_f8 = local_b0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b0,"ascension",&local_10e);
  local_f8 = local_90;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_90,"pentecost",&local_10f);
  local_f8 = local_70;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_70,"goodfriday",&local_110);
  offsets.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._7_1_ = 0;
  local_50 = (iterator)local_f0;
  local_48 = 5;
  this_00 = (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)((long)&offsets.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 6);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(this_00);
  __l_00._M_len = local_48;
  __l_00._M_array = local_50;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_40,__l_00,this_00);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)((long)&offsets.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage + 6));
  local_208 = (string *)&local_50;
  do {
    local_208 = local_208 + -0x20;
    std::__cxx11::string::~string(local_208);
  } while (local_208 != local_f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_110);
  std::allocator<char>::~allocator((allocator<char> *)&local_10f);
  std::allocator<char>::~allocator((allocator<char> *)&local_10e);
  std::allocator<char>::~allocator((allocator<char> *)local_10d);
  std::allocator<char>::~allocator((allocator<char> *)&local_f9);
  local_158[0] = 1;
  local_158[1] = 0;
  local_158[2] = 0x27;
  local_158[3] = 0x31;
  local_158[4] = 0xfffffffe;
  local_140 = local_158;
  local_138 = 5;
  std::allocator<int>::allocator(&local_159);
  __l._M_len = local_138;
  __l._M_array = local_140;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_130,__l,&local_159);
  std::allocator<int>::~allocator(&local_159);
  std::__cxx11::string::string(local_180);
  now._4_4_ = 0;
  do {
    if (4 < now._4_4_) {
      Pig::restoreTo(pig,(size_type)
                         holidays.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
      this_local._7_1_ = false;
LAB_001652e2:
      std::__cxx11::string::~string(local_180);
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)local_130);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_40);
      return this_local._7_1_;
    }
    literal = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_40,(long)now._4_4_);
    bVar1 = Pig::skipLiteral(pig,literal);
    if (bVar1) {
      uVar2 = Pig::peek(pig);
      bVar1 = unicodeLatinAlpha(uVar2);
      if (!bVar1) {
        uVar2 = Pig::peek(pig);
        bVar1 = unicodeLatinDigit(uVar2);
        if (!bVar1) {
          t = (tm *)time((time_t *)0x0);
          local_198 = localtime((time_t *)&t);
          easter(this,(tm *)local_198);
          tVar3 = mktime(local_198);
          this->_date = tVar3;
          if (this->_date < (long)t) {
            local_198 = localtime((time_t *)&t);
            local_198->tm_year = local_198->tm_year + 1;
            easter(this,(tm *)local_198);
          }
          pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)local_130,(long)now._4_4_);
          local_198->tm_mday = *pvVar4 + local_198->tm_mday;
          tVar3 = mktime(local_198);
          this->_date = tVar3;
          this_local._7_1_ = true;
          goto LAB_001652e2;
        }
      }
    }
    now._4_4_ = now._4_4_ + 1;
  } while( true );
}

Assistant:

bool Datetime::initializeEaster (Pig& pig)
{
  auto checkpoint = pig.cursor ();

  std::vector <std::string> holidays = {"eastermonday", "easter", "ascension", "pentecost", "goodfriday"};
  std::vector <int>         offsets  = {             1,        0,          39,          49,           -2};

  std::string token;
  for (int holiday = 0; holiday < 5; ++holiday)
  {
   if (pig.skipLiteral (holidays[holiday]) &&
       ! unicodeLatinAlpha (pig.peek ()) &&
       ! unicodeLatinDigit (pig.peek ()))
    {
      time_t now = time (nullptr);
      struct tm* t = localtime (&now);

      easter (t);
      _date = mktime (t);

      // If the result is earlier this year, then recalc for next year.
      if (_date < now)
      {
        t = localtime (&now);
        t->tm_year++;
        easter (t);
      }

      // Adjust according to holiday-specific offsets.
      t->tm_mday += offsets[holiday];

      _date = mktime (t);
      return true;
    }
  }

  pig.restoreTo (checkpoint);
  return false;
}